

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O1

void anon_unknown.dwarf_e222a::testSlerp(Quatf *q1,Quatf *q2)

{
  int m;
  int iVar1;
  float fVar4;
  double __y;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar5;
  float fVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar9;
  Quatf qiq3;
  Quatf q1q2;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  Quat<float> local_128;
  Quat<float> local_118;
  Quatf local_108;
  double local_f8;
  double dStack_f0;
  Quat<float> local_e8;
  Quatf local_d8;
  Quatf local_c8;
  Quat<float> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  double local_60;
  double dStack_58;
  double local_50;
  double dStack_48;
  Quatf local_40;
  
  iVar1 = 0;
  do {
    local_128.r = q1->r;
    local_128.v.x = (q1->v).x;
    local_128.v.y = (q1->v).y;
    local_128.v.z = (q1->v).z;
    local_e8.r = q2->r;
    local_e8.v.x = (q2->v).x;
    local_e8.v.y = (q2->v).y;
    local_e8.v.z = (q2->v).z;
    auVar2._0_8_ = CONCAT44(local_128.v.y,local_128.r) ^ 0x8000000000000000;
    auVar2._8_4_ = local_128.v.y;
    auVar2._12_4_ = local_128.v.z;
    fVar9 = local_128.r * local_128.r +
            local_128.v.z * local_128.v.z +
            local_128.v.x * local_128.v.x + local_128.v.y * local_128.v.y;
    auVar6._0_8_ = CONCAT44(local_128.v.x,local_128.v.z) ^ 0x8000000080000000;
    auVar6._8_4_ = -local_128.v.y;
    auVar6._12_4_ = -local_128.v.z;
    auVar3._4_4_ = fVar9;
    auVar3._0_4_ = fVar9;
    auVar3._8_4_ = fVar9;
    auVar3._12_4_ = fVar9;
    auVar3 = divps(auVar2,auVar3);
    auVar7._4_4_ = fVar9;
    auVar7._0_4_ = fVar9;
    auVar7._8_4_ = fVar9;
    auVar7._12_4_ = fVar9;
    auVar7 = divps(auVar6,auVar7);
    fVar9 = auVar3._0_4_;
    fVar4 = auVar3._4_4_;
    fVar5 = auVar7._0_4_;
    fVar8 = auVar7._4_4_;
    local_118.r = fVar9 * local_e8.r -
                  (fVar5 * local_e8.v.z + fVar8 * local_e8.v.x + fVar4 * local_e8.v.y);
    local_b8.r = 1.0;
    local_b8.v.x = 0.0;
    local_b8.v.y = 0.0;
    local_b8.v.z = 0.0;
    local_118.v.x =
         (local_e8.v.z * fVar4 - local_e8.v.y * fVar5) + local_e8.v.x * fVar9 + fVar8 * local_e8.r;
    local_118.v.y =
         (local_e8.v.x * fVar5 - local_e8.v.z * fVar8) + local_e8.r * fVar4 + fVar9 * local_e8.v.y;
    local_118.v.z =
         (fVar8 * local_e8.v.y - fVar4 * local_e8.v.x) + local_e8.r * fVar5 + local_e8.v.z * fVar9;
    Imath_3_2::slerp<float>((Imath_3_2 *)&local_40,&local_128,&local_e8,(float)iVar1 * 0.0625);
    Imath_3_2::slerp<float>((Imath_3_2 *)&local_138,&local_b8,&local_118,(float)iVar1 * 0.0625);
    local_108.v.z = local_138 * local_128.v.z + local_128.r * fStack_12c;
    __y = (double)(ulong)(uint)local_108.v.z;
    local_108.r = local_128.r * local_138 -
                  (local_128.v.z * fStack_12c +
                  local_128.v.x * fStack_134 + local_128.v.y * fStack_130);
    local_108.v.x =
         (fStack_12c * local_128.v.y - fStack_130 * local_128.v.z) +
         local_138 * local_128.v.x + local_128.r * fStack_134;
    local_108.v.y =
         (fStack_134 * local_128.v.z - fStack_12c * local_128.v.x) +
         local_138 * local_128.v.y + local_128.r * fStack_130;
    local_108.v.z = (fStack_130 * local_128.v.x - local_128.v.y * fStack_134) + local_108.v.z;
    compareQuats(&local_40,&local_108,7.1525574e-06);
    local_88._8_4_ = SUB84((double)fStack_134,0);
    local_88._0_8_ = (double)local_138;
    local_88._12_4_ = (int)((ulong)(double)fStack_134 >> 0x20);
    local_78._8_4_ = SUB84((double)fStack_12c,0);
    local_78._0_8_ = (double)fStack_130;
    local_78._12_4_ = (int)((ulong)(double)fStack_12c >> 0x20);
    pow((anon_unknown_dwarf_e222a *)&local_108,(double)fStack_130,__y);
    local_c8.v.y = (float)local_f8;
    local_c8.v.z = (float)dStack_f0;
    local_c8.r = (float)(double)CONCAT44(local_108.v.x,local_108.r);
    local_c8.v.x = (float)(double)CONCAT44(local_108.v.z,local_108.v.y);
    local_a8._8_4_ = SUB84((double)local_118.v.x,0);
    local_a8._0_8_ = (double)local_118.r;
    local_a8._12_4_ = (int)((ulong)(double)local_118.v.x >> 0x20);
    local_98._8_4_ = SUB84((double)local_118.v.z,0);
    local_98._0_8_ = (double)local_118.v.y;
    local_98._12_4_ = (int)((ulong)(double)local_118.v.z >> 0x20);
    pow((anon_unknown_dwarf_e222a *)&local_60,(double)local_118.v.y,
        (double)CONCAT44(local_c8.v.z,local_c8.v.y));
    local_d8.v.y = (float)local_50;
    local_d8.v.z = (float)dStack_48;
    local_d8.r = (float)local_60;
    local_d8.v.x = (float)dStack_58;
    compareQuats(&local_c8,&local_d8,7.1525574e-05);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x11);
  return;
}

Assistant:

void
testSlerp (const Quatf q1, const Quatf q2)
{
    const int n = 16;

    for (int m = 0; m <= n; ++m)
        testSlerp (q1, q2, m, n);
}